

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  iVar10 = bottom_blob->dims;
  if (iVar10 == 3) {
    iVar10 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    uVar1 = bottom_blob->c;
    Mat::create(top_blob,iVar10,iVar2,uVar1,1,opt->blob_allocator);
    if (top_blob->data != (void *)0x0) {
      uVar16 = 0xffffff9c;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        uVar17 = iVar2 * iVar10;
        if (this->bias_data_size == 0) {
          uVar18 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar18 = 0;
          }
          uVar15 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar15 = 0;
          }
          for (uVar14 = 0; uVar16 = 0, uVar14 != uVar15; uVar14 = uVar14 + 1) {
            sVar5 = bottom_blob->cstep;
            sVar6 = top_blob->cstep;
            uVar12 = uVar14 & 0xffffffff;
            if (this->scale_in_data_size == 1) {
              uVar12 = uVar16;
            }
            fVar22 = *(float *)((long)(this->scale_in_data).data + uVar12 * 4);
            uVar12 = uVar14 & 0xffffffff;
            if (this->scale_out_data_size == 1) {
              uVar12 = uVar16;
            }
            fVar20 = *(float *)((long)(this->scale_out_data).data + uVar12 * 4);
            sVar7 = top_blob->elemsize;
            pvVar3 = top_blob->data;
            sVar8 = bottom_blob->elemsize;
            pvVar4 = bottom_blob->data;
            for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              fVar19 = activation_ss((float)*(int *)((long)pvVar4 +
                                                    uVar16 * 4 + sVar5 * sVar8 * uVar14) * fVar22,
                                     this->activation_type,&this->activation_params);
              fVar19 = roundf(fVar19 * fVar20);
              iVar10 = (int)fVar19;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16 + sVar6 * sVar7 * uVar14) = (char)iVar10;
            }
          }
        }
        else {
          uVar18 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar18 = 0;
          }
          uVar15 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar15 = 0;
          }
          for (uVar14 = 0; uVar16 = 0, uVar14 != uVar15; uVar14 = uVar14 + 1) {
            sVar5 = bottom_blob->cstep;
            sVar6 = top_blob->cstep;
            uVar12 = uVar14 & 0xffffffff;
            uVar13 = uVar12;
            if (this->scale_in_data_size == 1) {
              uVar13 = uVar16;
            }
            fVar22 = *(float *)((long)(this->scale_in_data).data + uVar13 * 4);
            uVar13 = uVar12;
            if (this->scale_out_data_size == 1) {
              uVar13 = uVar16;
            }
            fVar20 = *(float *)((long)(this->scale_out_data).data + uVar13 * 4);
            if (this->bias_data_size == 1) {
              uVar12 = uVar16;
            }
            fVar19 = *(float *)((long)(this->bias_data).data + uVar12 * 4);
            sVar7 = top_blob->elemsize;
            pvVar3 = top_blob->data;
            sVar8 = bottom_blob->elemsize;
            pvVar4 = bottom_blob->data;
            for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = activation_ss((float)*(int *)((long)pvVar4 +
                                                    uVar16 * 4 + sVar5 * sVar8 * uVar14) * fVar22 +
                                     fVar19,this->activation_type,&this->activation_params);
              fVar21 = roundf(fVar21 * fVar20);
              iVar10 = (int)fVar21;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16 + sVar6 * sVar7 * uVar14) = (char)iVar10;
            }
          }
        }
      }
      goto LAB_004029f2;
    }
  }
  else if (iVar10 == 2) {
    uVar1 = bottom_blob->w;
    uVar17 = bottom_blob->h;
    Mat::create(top_blob,uVar1,uVar17,1,opt->blob_allocator);
    if (top_blob->data != (void *)0x0) {
      uVar16 = 0xffffff9c;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        if (this->bias_data_size == 0) {
          uVar18 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar18 = 0;
          }
          uVar15 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar15 = 0;
          }
          for (uVar14 = 0; uVar16 = 0, uVar14 != uVar15; uVar14 = uVar14 + 1) {
            iVar10 = bottom_blob->w;
            iVar2 = top_blob->w;
            uVar12 = uVar14 & 0xffffffff;
            if (this->scale_in_data_size == 1) {
              uVar12 = uVar16;
            }
            fVar22 = *(float *)((long)(this->scale_in_data).data + uVar12 * 4);
            uVar12 = uVar14 & 0xffffffff;
            if (this->scale_out_data_size == 1) {
              uVar12 = uVar16;
            }
            fVar20 = *(float *)((long)(this->scale_out_data).data + uVar12 * 4);
            sVar5 = top_blob->elemsize;
            pvVar3 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            pvVar4 = bottom_blob->data;
            for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              fVar19 = activation_ss((float)*(int *)((long)pvVar4 +
                                                    uVar16 * 4 + sVar6 * uVar14 * (long)iVar10) *
                                     fVar22,this->activation_type,&this->activation_params);
              fVar19 = roundf(fVar19 * fVar20);
              iVar11 = (int)fVar19;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              if (0x7e < iVar11) {
                iVar11 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16 + sVar5 * uVar14 * (long)iVar2) = (char)iVar11;
            }
          }
        }
        else {
          uVar18 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar18 = 0;
          }
          uVar15 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar15 = 0;
          }
          for (uVar14 = 0; uVar16 = 0, uVar14 != uVar15; uVar14 = uVar14 + 1) {
            iVar10 = bottom_blob->w;
            iVar2 = top_blob->w;
            uVar12 = uVar14 & 0xffffffff;
            uVar13 = uVar12;
            if (this->scale_in_data_size == 1) {
              uVar13 = uVar16;
            }
            fVar22 = *(float *)((long)(this->scale_in_data).data + uVar13 * 4);
            uVar13 = uVar12;
            if (this->scale_out_data_size == 1) {
              uVar13 = uVar16;
            }
            fVar20 = *(float *)((long)(this->scale_out_data).data + uVar13 * 4);
            if (this->bias_data_size == 1) {
              uVar12 = uVar16;
            }
            fVar19 = *(float *)((long)(this->bias_data).data + uVar12 * 4);
            sVar5 = top_blob->elemsize;
            pvVar3 = top_blob->data;
            sVar6 = bottom_blob->elemsize;
            pvVar4 = bottom_blob->data;
            for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = activation_ss((float)*(int *)((long)pvVar4 +
                                                    uVar16 * 4 + sVar6 * uVar14 * (long)iVar10) *
                                     fVar22 + fVar19,this->activation_type,&this->activation_params)
              ;
              fVar21 = roundf(fVar21 * fVar20);
              iVar11 = (int)fVar21;
              if (iVar11 < -0x7e) {
                iVar11 = -0x7f;
              }
              if (0x7e < iVar11) {
                iVar11 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16 + sVar5 * uVar14 * (long)iVar2) = (char)iVar11;
            }
          }
        }
      }
      goto LAB_004029f2;
    }
  }
  else {
    uVar16 = 0;
    if (iVar10 != 1) goto LAB_004029f2;
    uVar1 = bottom_blob->w;
    Mat::create(top_blob,uVar1,1,opt->blob_allocator);
    pvVar3 = top_blob->data;
    if (pvVar3 != (void *)0x0) {
      uVar16 = 0xffffff9c;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        pvVar4 = bottom_blob->data;
        iVar10 = this->scale_in_data_size;
        iVar2 = this->scale_out_data_size;
        if (iVar2 == 1 && iVar10 == 1) {
          fVar22 = *(this->scale_in_data).data;
          fVar20 = *(this->scale_out_data).data;
          if (this->bias_data_size == 1) {
            fVar19 = *(this->bias_data).data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
              fVar21 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) * fVar22 + fVar19,
                                     this->activation_type,&this->activation_params);
              fVar21 = roundf(fVar21 * fVar20);
              iVar10 = (int)fVar21;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
            }
          }
          else if (this->bias_data_size == 0) {
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
              fVar19 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) * fVar22,
                                     this->activation_type,&this->activation_params);
              fVar19 = roundf(fVar19 * fVar20);
              iVar10 = (int)fVar19;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
            }
          }
          else {
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
              fVar19 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) * fVar22 +
                                     *(float *)((long)(this->bias_data).data + uVar16 * 4),
                                     this->activation_type,&this->activation_params);
              fVar19 = roundf(fVar19 * fVar20);
              iVar10 = (int)fVar19;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
            }
          }
        }
        else if (iVar2 < 2 || iVar10 != 1) {
          if (iVar10 < 2 || iVar2 != 1) {
            if (this->bias_data_size == 1) {
              fVar22 = *(this->bias_data).data;
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
                fVar20 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) *
                                       *(float *)((long)(this->scale_in_data).data + uVar16 * 4) +
                                       fVar22,this->activation_type,&this->activation_params);
                fVar20 = roundf(fVar20 * *(float *)((long)(this->scale_out_data).data + uVar16 * 4))
                ;
                iVar10 = (int)fVar20;
                if (iVar10 < -0x7e) {
                  iVar10 = -0x7f;
                }
                uVar9 = (undefined1)iVar10;
                if (0x7e < iVar10) {
                  uVar9 = 0x7f;
                }
                *(undefined1 *)((long)pvVar3 + uVar16) = uVar9;
              }
            }
            else if (this->bias_data_size == 0) {
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
                fVar22 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) *
                                       *(float *)((long)(this->scale_in_data).data + uVar16 * 4),
                                       this->activation_type,&this->activation_params);
                fVar22 = roundf(fVar22 * *(float *)((long)(this->scale_out_data).data + uVar16 * 4))
                ;
                iVar10 = (int)fVar22;
                if (iVar10 < -0x7e) {
                  iVar10 = -0x7f;
                }
                uVar9 = (undefined1)iVar10;
                if (0x7e < iVar10) {
                  uVar9 = 0x7f;
                }
                *(undefined1 *)((long)pvVar3 + uVar16) = uVar9;
              }
            }
            else {
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
                fVar22 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) *
                                       *(float *)((long)(this->scale_in_data).data + uVar16 * 4) +
                                       *(float *)((long)(this->bias_data).data + uVar16 * 4),
                                       this->activation_type,&this->activation_params);
                fVar22 = roundf(fVar22 * *(float *)((long)(this->scale_out_data).data + uVar16 * 4))
                ;
                iVar10 = (int)fVar22;
                if (iVar10 < -0x7e) {
                  iVar10 = -0x7f;
                }
                uVar9 = (undefined1)iVar10;
                if (0x7e < iVar10) {
                  uVar9 = 0x7f;
                }
                *(undefined1 *)((long)pvVar3 + uVar16) = uVar9;
              }
            }
          }
          else {
            fVar22 = *(this->scale_out_data).data;
            if (this->bias_data_size == 1) {
              fVar20 = *(this->bias_data).data;
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
                fVar19 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) *
                                       *(float *)((long)(this->scale_in_data).data + uVar16 * 4) +
                                       fVar20,this->activation_type,&this->activation_params);
                fVar19 = roundf(fVar19 * fVar22);
                iVar10 = (int)fVar19;
                if (iVar10 < -0x7e) {
                  iVar10 = -0x7f;
                }
                if (0x7e < iVar10) {
                  iVar10 = 0x7f;
                }
                *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
              }
            }
            else if (this->bias_data_size == 0) {
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
                fVar20 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) *
                                       *(float *)((long)(this->scale_in_data).data + uVar16 * 4),
                                       this->activation_type,&this->activation_params);
                fVar20 = roundf(fVar20 * fVar22);
                iVar10 = (int)fVar20;
                if (iVar10 < -0x7e) {
                  iVar10 = -0x7f;
                }
                if (0x7e < iVar10) {
                  iVar10 = 0x7f;
                }
                *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
              }
            }
            else {
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
                fVar20 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) *
                                       *(float *)((long)(this->scale_in_data).data + uVar16 * 4) +
                                       *(float *)((long)(this->bias_data).data + uVar16 * 4),
                                       this->activation_type,&this->activation_params);
                fVar20 = roundf(fVar20 * fVar22);
                iVar10 = (int)fVar20;
                if (iVar10 < -0x7e) {
                  iVar10 = -0x7f;
                }
                uVar9 = (undefined1)iVar10;
                if (0x7e < iVar10) {
                  uVar9 = 0x7f;
                }
                *(undefined1 *)((long)pvVar3 + uVar16) = uVar9;
              }
            }
          }
        }
        else {
          fVar22 = *(this->scale_in_data).data;
          if (this->bias_data_size == 1) {
            fVar20 = *(this->bias_data).data;
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
              fVar19 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) * fVar22 + fVar20,
                                     this->activation_type,&this->activation_params);
              fVar19 = roundf(fVar19 * *(float *)((long)(this->scale_out_data).data + uVar16 * 4));
              iVar10 = (int)fVar19;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
            }
          }
          else if (this->bias_data_size == 0) {
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
              fVar20 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) * fVar22,
                                     this->activation_type,&this->activation_params);
              fVar20 = roundf(fVar20 * *(float *)((long)(this->scale_out_data).data + uVar16 * 4));
              iVar10 = (int)fVar20;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              *(char *)((long)pvVar3 + uVar16) = (char)iVar10;
            }
          }
          else {
            if ((int)uVar1 < 1) {
              uVar1 = 0;
            }
            for (uVar16 = 0; uVar1 != uVar16; uVar16 = uVar16 + 1) {
              fVar20 = activation_ss((float)*(int *)((long)pvVar4 + uVar16 * 4) * fVar22 +
                                     *(float *)((long)(this->bias_data).data + uVar16 * 4),
                                     this->activation_type,&this->activation_params);
              fVar20 = roundf(fVar20 * *(float *)((long)(this->scale_out_data).data + uVar16 * 4));
              iVar10 = (int)fVar20;
              if (iVar10 < -0x7e) {
                iVar10 = -0x7f;
              }
              uVar9 = (undefined1)iVar10;
              if (0x7e < iVar10) {
                uVar9 = 0x7f;
              }
              *(undefined1 *)((long)pvVar3 + uVar16) = uVar9;
            }
          }
        }
        uVar16 = 0;
      }
      goto LAB_004029f2;
    }
  }
  uVar16 = 0xffffff9c;
LAB_004029f2:
  return (int)uVar16;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        if (scale_in_data_size == 1 && scale_out_data_size == 1)
        {
            const float scale_in = scale_in_data[0];
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else if (scale_in_data_size == 1 && scale_out_data_size > 1)
        {
            const float scale_in = scale_in_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
        else if (scale_in_data_size > 1 && scale_out_data_size == 1)
        {
            const float scale_out = scale_out_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else // if (scale_in_data_size > 1 && scale_out_data_size > 1)
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float v = intptr[i] * scale_in_data[i] + bias_data[i];
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out_data[i]);
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    float v = intptr[j] * scale_in + bias;
                    ptr[j] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
                const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    float v = intptr[i] * scale_in + bias;
                    ptr[i] = float2int8(activation_ss(v, activation_type, activation_params) * scale_out);
                }
            }
        }
    }

    return 0;
}